

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::ArchiveOUT(ChLinkMateGeneric *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrame<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMateGeneric>(marchive);
  ChArchiveOut::VersionWrite<chrono::ChLinkMate>(marchive);
  ChLink::ArchiveOUT((ChLink *)this,marchive);
  local_38._value = &this->frame1;
  local_38._name = "frame1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrame<double>>(marchive,&local_38);
  local_38._value = &this->frame2;
  local_38._name = "frame2";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrame<double>>(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->c_x;
  local_38._name = "c_x";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->c_y;
  local_38._name = "c_y";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->c_z;
  local_38._name = "c_z";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->c_rx;
  local_38._name = "c_rx";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->c_ry;
  local_38._name = "c_ry";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->c_rz;
  local_38._name = "c_rz";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkMateGeneric::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMateGeneric>();

    // serialize parent class
    ChLinkMate::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(frame1);
    marchive << CHNVP(frame2);
    marchive << CHNVP(c_x);
    marchive << CHNVP(c_y);
    marchive << CHNVP(c_z);
    marchive << CHNVP(c_rx);
    marchive << CHNVP(c_ry);
    marchive << CHNVP(c_rz);
}